

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,void *value)

{
  undefined4 uVar1;
  format_specs *pfVar2;
  undefined3 uVar3;
  format_error *this_00;
  basic_format_specs<char> local_28;
  
  pfVar2 = this->specs_;
  if ((pfVar2->type_ != '\0') && (pfVar2->type_ != 'p')) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,"invalid type specifier");
    __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_28.super_align_spec.width_ = (pfVar2->super_align_spec).width_;
  local_28.super_align_spec.fill_ = (pfVar2->super_align_spec).fill_;
  uVar1 = pfVar2->precision_;
  uVar3 = *(undefined3 *)&pfVar2->field_0x15;
  local_28.super_align_spec.align_ = (alignment)*(undefined8 *)&(pfVar2->super_align_spec).align_;
  local_28.flags_ = 8;
  local_28.type_ = 'x';
  local_28.precision_ = uVar1;
  local_28._21_3_ = uVar3;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_int<unsigned_long,fmt::v5::basic_format_specs<char>>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)this
             ,(unsigned_long)value,&local_28);
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(const void *value) {
    check_pointer_type_spec(specs_.type_, internal::error_handler());
    write_pointer(value);
    return out();
  }